

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::Picker::_q_rowsRemoved(Picker *this,QModelIndex *parent,int start,int end)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  QModelIndex local_60;
  QModelIndex local_48;
  
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&((this->d).d)->root);
  bVar3 = QModelIndex::operator!=(parent,&local_60);
  if (!bVar3) {
    iVar5 = QPersistentModelIndex::row();
    pPVar1 = (this->d).d;
    if (iVar5 == pPVar1->indexBeforeChange) {
      bVar3 = PickerPrivate::isRowsVisible(pPVar1,start,end);
      if (bVar3) {
        QWidget::update();
      }
    }
    else {
      cVar4 = QPersistentModelIndex::isValid();
      if ((cVar4 == '\0') && (iVar5 = count(this), iVar5 != 0)) {
        iVar6 = count(this);
        pPVar1 = (this->d).d;
        iVar5 = 0;
        if (0 < pPVar1->indexBeforeChange) {
          iVar5 = pPVar1->indexBeforeChange;
        }
        if (iVar6 + -1 < iVar5) {
          iVar5 = iVar6 + -1;
        }
        pQVar2 = pPVar1->model;
        iVar6 = pPVar1->modelColumn;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_60,pQVar2,iVar5,iVar6,&local_48);
        QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_60);
        setCurrentIndex(this,iVar5);
        return;
      }
      QWidget::update();
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&((this->d).d)->currentIndex);
      _q_emitCurrentIndexChanged(this,&local_60);
    }
  }
  return;
}

Assistant:

void
Picker::_q_rowsRemoved( const QModelIndex & parent, int start, int end )
{
	if( parent != d->root )
		return;

	// model has changed the currentIndex
	if( d->currentIndex.row() != d->indexBeforeChange )
	{
		if( !d->currentIndex.isValid() && count() )
		{
			const int index = qMin( count() - 1, qMax( d->indexBeforeChange, 0 ) );
			d->topItemIndex = d->model->index( index, d->modelColumn, d->root );
			setCurrentIndex( index );
			return;
		}

		update();
		_q_emitCurrentIndexChanged( d->currentIndex );
	}
	else if( d->isRowsVisible( start, end ) )
		update();
}